

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O1

CbString * __thiscall
Hpipe::CbString::read_line
          (CbString *__return_storage_ptr__,CbString *this,char sep,bool skip_void_lines)

{
  Buffer *pBVar1;
  long lVar2;
  PT PVar3;
  ulong uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  Buffer *pBVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (((int)CONCAT71(in_register_00000009,skip_void_lines) != 0) &&
     (PVar3 = this->off, this->end != PVar3)) {
    do {
      if ((uint)this->beg->data[PVar3] != (int)sep) break;
      read_byte(this);
      PVar3 = this->off;
    } while (this->end != PVar3);
  }
  uVar9 = this->off;
  uVar8 = this->end;
  if (uVar8 <= uVar9) {
    uVar9 = 0;
    goto LAB_00137ef0;
  }
  pBVar1 = this->beg;
  uVar7 = pBVar1->used;
  uVar4 = uVar8 - uVar7;
  uVar5 = (uint)uVar9;
  if (uVar8 < uVar7 || uVar4 == 0) {
    if (uVar5 < (uint)uVar8) {
      uVar7 = uVar9 & 0xffffffff;
      if ((uint)pBVar1->data[uVar7] == (int)sep) {
        bVar10 = false;
        uVar7 = uVar9;
      }
      else {
        do {
          if ((uVar8 & 0xffffffff) - 1 == uVar7) goto LAB_00137d7b;
          lVar2 = uVar7 + 1;
          uVar7 = uVar7 + 1;
        } while ((uint)pBVar1->data[lVar2] != (int)sep);
        bVar10 = (uVar8 & 0xffffffff) <= uVar7;
      }
      uVar9 = (ulong)((int)uVar7 - uVar5);
      if (!bVar10) goto LAB_00137ef0;
    }
    else {
LAB_00137d7b:
      uVar9 = 0;
    }
    uVar9 = uVar9 + ((uint)uVar8 - uVar5);
    goto LAB_00137ef0;
  }
  pBVar6 = pBVar1->next;
  bVar10 = (uint)uVar7 <= uVar5;
  if (bVar10) {
LAB_00137d8b:
    uVar9 = 0;
LAB_00137d8e:
    uVar9 = uVar9 + ((uint)uVar7 - uVar5);
  }
  else {
    uVar8 = uVar9 & 0xffffffff;
    if ((uint)pBVar1->data[uVar8] == (int)sep) {
      bVar10 = false;
      uVar8 = uVar9;
    }
    else {
      do {
        if ((uVar7 & 0xffffffff) - 1 == uVar8) {
          bVar10 = true;
          goto LAB_00137d8b;
        }
        lVar2 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while ((uint)pBVar1->data[lVar2] != (int)sep);
      bVar10 = (uVar7 & 0xffffffff) <= uVar8;
    }
    uVar9 = (ulong)((int)uVar8 - uVar5);
    if (bVar10) goto LAB_00137d8e;
  }
  if ((bool)(pBVar6 != (Buffer *)0x0 & bVar10)) {
    uVar5 = (uint)sep;
    do {
      uVar8 = pBVar6->used;
      uVar7 = uVar4 - uVar8;
      if (uVar4 < uVar8 || uVar7 == 0) {
        uVar4 = uVar4 & 0xffffffff;
        if (uVar4 == 0) goto LAB_00137eed;
        if (pBVar6->data[0] != uVar5) {
          uVar8 = 0;
          goto LAB_00137ea1;
        }
        bVar10 = false;
        uVar8 = 0;
        goto LAB_00137eba;
      }
      uVar8 = uVar8 & 0xffffffff;
      bVar10 = uVar8 == 0;
      if (bVar10) {
LAB_00137dff:
        uVar9 = uVar9 + uVar8;
      }
      else {
        if (pBVar6->data[0] == uVar5) {
          bVar10 = false;
          uVar4 = 0;
        }
        else {
          uVar4 = 0;
          do {
            if (uVar8 - 1 == uVar4) {
              bVar10 = true;
              goto LAB_00137dff;
            }
            lVar2 = uVar4 + 1;
            uVar4 = uVar4 + 1;
          } while (pBVar6->data[lVar2] != uVar5);
          bVar10 = uVar8 <= uVar4;
        }
        uVar9 = uVar9 + uVar4;
        if (bVar10) goto LAB_00137dff;
      }
      if (!bVar10) break;
      pBVar1 = pBVar6->next;
      uVar8 = pBVar1->used;
      uVar4 = uVar7 - uVar8;
      if (uVar7 < uVar8 || uVar4 == 0) {
        if ((int)uVar7 == 0) goto LAB_00137eeb;
        if (pBVar1->data[0] != uVar5) {
          uVar8 = 0;
          goto LAB_00137ecb;
        }
        bVar10 = false;
        uVar8 = 0;
        goto LAB_00137ee4;
      }
      uVar8 = uVar8 & 0xffffffff;
      bVar10 = uVar8 == 0;
      if (bVar10) {
LAB_00137e5f:
        uVar9 = uVar9 + uVar8;
      }
      else {
        if (pBVar1->data[0] == uVar5) {
          bVar10 = false;
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          do {
            if (uVar8 - 1 == uVar7) {
              bVar10 = true;
              goto LAB_00137e5f;
            }
            lVar2 = uVar7 + 1;
            uVar7 = uVar7 + 1;
          } while (pBVar1->data[lVar2] != uVar5);
          bVar10 = uVar8 <= uVar7;
        }
        uVar9 = uVar9 + uVar7;
        if (bVar10) goto LAB_00137e5f;
      }
      pBVar6 = pBVar1->next;
    } while (bVar10);
  }
  goto LAB_00137ef0;
  while (lVar2 = uVar8 + 1, uVar8 = uVar8 + 1, pBVar6->data[lVar2] != uVar5) {
LAB_00137ea1:
    if (uVar4 - 1 == uVar8) goto LAB_00137eed;
  }
  bVar10 = uVar4 <= uVar8;
LAB_00137eba:
  uVar9 = uVar9 + uVar8;
  if (!bVar10) goto LAB_00137ef0;
  goto LAB_00137eed;
  while (lVar2 = uVar8 + 1, uVar8 = uVar8 + 1, pBVar1->data[lVar2] != uVar5) {
LAB_00137ecb:
    if ((uVar7 & 0xffffffff) - 1 == uVar8) goto LAB_00137eeb;
  }
  bVar10 = (uVar7 & 0xffffffff) <= uVar8;
LAB_00137ee4:
  uVar9 = uVar9 + uVar8;
  if (!bVar10) goto LAB_00137ef0;
LAB_00137eeb:
  uVar4 = uVar7 & 0xffffffff;
LAB_00137eed:
  uVar9 = uVar9 + uVar4;
LAB_00137ef0:
  CbString(__return_storage_ptr__,this,0,uVar9);
  skip_some(this,uVar9 + 1);
  return __return_storage_ptr__;
}

Assistant:

CbString CbString::read_line( char sep, bool skip_void_lines ) {
    if ( skip_void_lines )
        while ( not empty() and *ptr() == sep )
            skip_byte();
    // find sep
    PT pcr = 0;
    visitor( [ &pcr, sep ]( const Buffer *b, unsigned off, unsigned used ) {
        for( unsigned val = off; val < used; ++val ) {
            if ( b->data[ val ] == sep ) {
                pcr += val - off;
                return false;
            }
        }
        pcr += used - off;
        return true;
    } );
    CbString res{ *this, 0, pcr };
    skip_some( pcr + 1 );
    return res;
}